

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O0

void * lj_lightud_intern(lua_State *L,void *p)

{
  uint64_t uVar1;
  int iVar2;
  uint local_64;
  uint local_48;
  uint local_44;
  MSize seg;
  MSize segnum;
  uint32_t *segmap;
  uint32_t up;
  uint64_t u;
  global_State *g;
  void *p_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  iVar2 = (int)(((ulong)p >> 0x27) << 7);
  _seg = *(void **)(uVar1 + 0x70);
  local_44 = (uint)*(byte *)(uVar1 + 0x23);
  if (_seg != (void *)0x0) {
    for (local_48 = 0; local_48 <= local_44; local_48 = local_48 + 1) {
      if (*(int *)((long)_seg + (ulong)local_48 * 4) == iVar2) {
        return (void *)((ulong)local_48 << 0x27 | (ulong)p & 0x7fffffffff);
      }
    }
    local_44 = local_44 + 1;
    if (0xfe < local_44) {
      lj_err_msg(L,LJ_ERR_BADLU);
    }
  }
  if (((local_44 - 1 & local_44) == 0) && (local_44 != 1)) {
    if (local_44 == 0) {
      local_64 = 2;
    }
    else {
      local_64 = local_44 << 1;
    }
    _seg = lj_mem_realloc(L,_seg,(ulong)local_44 << 2,(ulong)local_64 << 2);
    *(void **)(uVar1 + 0x70) = _seg;
  }
  *(char *)(uVar1 + 0x23) = (char)local_44;
  *(int *)((long)_seg + (ulong)local_44 * 4) = iVar2;
  return (void *)((ulong)local_44 << 0x27 | (ulong)p & 0x7fffffffff);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}